

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

config_value *
parser_resolve_array_values(parser *parser,char **value_items,size_t value_items_length)

{
  config_value *pcVar1;
  config_value *local_48;
  size_t j;
  config_value *item;
  size_t i;
  config_value *config_value;
  size_t value_items_length_local;
  char **value_items_local;
  parser *parser_local;
  
  parser_local = (parser *)config_value_create_array(value_items_length);
  if (parser_local == (parser *)0x0) {
    parser_local = (parser *)0x0;
  }
  else {
    for (item = (config_value *)0x0; item < value_items_length;
        item = (config_value *)((long)&item->type + 1)) {
      pcVar1 = parser_parse_value(parser,value_items[(long)item]);
      if (pcVar1 == (config_value *)0x0) {
        for (local_48 = item; local_48 < value_items_length;
            local_48 = (config_value *)((long)&local_48->type + 1)) {
          free(value_items[(long)local_48]);
        }
        config_value_destroy((config_value *)parser_local);
        return (config_value *)0x0;
      }
      ((anon_union_8_4_a3489a58_for_data *)&parser_local->buffer_size)->array->values[(long)item] =
           pcVar1;
    }
  }
  return (config_value *)parser_local;
}

Assistant:

static struct config_value *parser_resolve_array_values(struct parser *parser, char **value_items,
                                                        size_t value_items_length)
{
        struct config_value *config_value = config_value_create_array(value_items_length);

        if (config_value == NULL) {
                return NULL;
        }

        // Resolve and insert config_values into the array
        for (size_t i = 0; i < value_items_length; ++i) {
                struct config_value *item = parser_parse_value(parser, value_items[i]);

                if (item == NULL) {
                        for (size_t j = i; j < value_items_length; ++j) {
                                free(value_items[j]);
                        }

                        config_value_destroy(config_value);

                        return NULL;
                }

                config_value->data.array->values[i] = item;
        }

        return config_value;
}